

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# epoll_kqueue.c
# Opt level: O2

us_loop_t *
us_create_loop(void *hint,_func_void_us_loop_t_ptr *wakeup_cb,_func_void_us_loop_t_ptr *pre_cb,
              _func_void_us_loop_t_ptr *post_cb,uint ext_size)

{
  int iVar1;
  us_loop_t *loop;
  
  loop = (us_loop_t *)malloc((ulong)ext_size + 0x3070);
  loop->num_polls = 0;
  loop->num_ready_polls = 0;
  loop->current_ready_poll = 0;
  iVar1 = epoll_create1(0x80000);
  loop->fd = iVar1;
  us_internal_loop_data_init(loop,wakeup_cb,pre_cb,post_cb);
  return loop;
}

Assistant:

struct us_loop_t *us_create_loop(void *hint, void (*wakeup_cb)(struct us_loop_t *loop), void (*pre_cb)(struct us_loop_t *loop), void (*post_cb)(struct us_loop_t *loop), unsigned int ext_size) {
    struct us_loop_t *loop = (struct us_loop_t *) malloc(sizeof(struct us_loop_t) + ext_size);
    loop->num_polls = 0;
    /* These could be accessed if we close a poll before starting the loop */
    loop->num_ready_polls = 0;
    loop->current_ready_poll = 0;

#ifdef LIBUS_USE_EPOLL
    loop->fd = epoll_create1(EPOLL_CLOEXEC);
#else
    loop->fd = kqueue();
#endif

    us_internal_loop_data_init(loop, wakeup_cb, pre_cb, post_cb);
    return loop;
}